

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::BlockMapPrepareLongKey(Emitter *this,value child)

{
  bool bVar1;
  pointer pEVar2;
  size_t n_;
  Emitter *this_00;
  int in_ESI;
  size_t in_RDI;
  size_t childCount;
  size_t curIndent;
  IndentTo *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffdf;
  
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef8aac);
  n_ = EmitterState::CurIndent(pEVar2);
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef8ac3);
  this_00 = (Emitter *)
            EmitterState::CurGroupChildCount
                      ((EmitterState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                      );
  if (in_ESI == 0) {
    return;
  }
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef8ae6);
  bVar1 = EmitterState::HasBegunContent(pEVar2);
  if (!bVar1) {
    if (this_00 != (Emitter *)0x0) {
      YAML::operator<<((ostream_wrapper *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (char (*) [2])in_stack_ffffffffffffffb8);
    }
    bVar1 = ostream_wrapper::comment((ostream_wrapper *)(in_RDI + 8));
    if (bVar1) {
      YAML::operator<<((ostream_wrapper *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (char (*) [2])in_stack_ffffffffffffffb8);
    }
    IndentTo::IndentTo((IndentTo *)&stack0xffffffffffffffd8,n_);
    YAML::operator<<((ostream_wrapper *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    YAML::operator<<((ostream_wrapper *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (char (*) [2])in_stack_ffffffffffffffb8);
  }
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI - 1U < 3) {
LAB_00ef8bbb:
    SpaceOrIndentTo(this_00,(bool)in_stack_ffffffffffffffdf,in_RDI);
  }
  else {
    if (in_ESI != 4) {
      if (in_ESI == 5) goto LAB_00ef8bbb;
      if (in_ESI != 6) {
        return;
      }
    }
    pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef8bdf);
    bVar1 = EmitterState::HasBegunContent(pEVar2);
    if (bVar1) {
      YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
                       (char (*) [2])in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareLongKey(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();
  const std::size_t childCount = m_pState->CurGroupChildCount();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunContent()) {
    if (childCount > 0) {
      m_stream << "\n";
    }
    if (m_stream.comment()) {
      m_stream << "\n";
    }
    m_stream << IndentTo(curIndent);
    m_stream << "?";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(true, curIndent + 1);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunContent())
        m_stream << "\n";
      break;
  }
}